

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cap.cc
# Opt level: O3

bool __thiscall S2Cap::MayIntersect(S2Cap *this,S2Cell *cell)

{
  bool bVar1;
  long lVar2;
  S2Point *p;
  S2Point vertices [4];
  S2Point local_a0;
  S2Point local_88;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  p = &local_88;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_88.c_[2] = 0.0;
  uStack_70 = 0;
  local_88.c_[0] = 0.0;
  local_88.c_[1] = 0.0;
  lVar2 = 0;
  do {
    S2Cell::GetVertex(&local_a0,cell,(int)lVar2);
    p->c_[2] = local_a0.c_[2];
    p->c_[0] = local_a0.c_[0];
    p->c_[1] = local_a0.c_[1];
    bVar1 = Contains(this,p);
    if (bVar1) {
      return true;
    }
    lVar2 = lVar2 + 1;
    p = p + 1;
  } while (lVar2 != 4);
  bVar1 = Intersects(this,cell,&local_88);
  return bVar1;
}

Assistant:

bool S2Cap::MayIntersect(const S2Cell& cell) const {
  // If the cap contains any cell vertex, return true.
  S2Point vertices[4];
  for (int k = 0; k < 4; ++k) {
    vertices[k] = cell.GetVertex(k);
    if (Contains(vertices[k])) return true;
  }
  return Intersects(cell, vertices);
}